

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftutil.c
# Opt level: O2

FT_Pointer ft_mem_strdup(FT_Memory memory,char *str,FT_Error *p_error)

{
  size_t sVar1;
  FT_Pointer pvVar2;
  FT_ULong size;
  
  if (str == (char *)0x0) {
    size = 0;
  }
  else {
    sVar1 = strlen(str);
    size = sVar1 + 1;
  }
  pvVar2 = ft_mem_dup(memory,str,size,p_error);
  return pvVar2;
}

Assistant:

FT_BASE_DEF( FT_Pointer )
  ft_mem_strdup( FT_Memory    memory,
                 const char*  str,
                 FT_Error    *p_error )
  {
    FT_ULong  len = str ? (FT_ULong)ft_strlen( str ) + 1
                        : 0;


    return ft_mem_dup( memory, str, len, p_error );
  }